

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tankclient.cpp
# Opt level: O0

void __thiscall TankClient::TankClient(TankClient *this,TankOptions *utils)

{
  time_t tVar1;
  TankOptions *utils_local;
  TankClient *this_local;
  
  this->moveUp[0] = 'm';
  this->moveUp[1] = 'u';
  this->moveDown[0] = 'm';
  this->moveDown[1] = 'd';
  this->moveLeft[0] = 'm';
  this->moveLeft[1] = 'l';
  this->moveRight[0] = 'm';
  this->moveRight[1] = 'r';
  this->fireUp[0] = 'f';
  this->fireUp[1] = 'u';
  this->fireDown[0] = 'f';
  this->fireDown[1] = 'd';
  this->fireLeft[0] = 'f';
  this->fireLeft[1] = 'l';
  this->fireRight[0] = 'f';
  this->fireRight[1] = 'r';
  this->noCommand[0] = 'n';
  this->noCommand[1] = 'o';
  this->requestFromServer[0] = 'r';
  this->requestFromServer[1] = 'e';
  std::mutex::mutex(&this->commandMutex);
  this->mUtils = utils;
  this->lastCommand = NO_COMMAND;
  this->wasLastMove = false;
  this->lastCommandSuccess = true;
  this->threadControl = true;
  this->commandWanted = false;
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  return;
}

Assistant:

TankClient::TankClient(TankOptions *utils) :
    mUtils(utils),
    lastCommand(NO_COMMAND),
    wasLastMove(false),
    lastCommandSuccess(true),
    threadControl(true),
    commandWanted(false)
{
    srand(time(NULL));
    //keyThread = new std::thread(&TankClient::readKey, this); //wrong approach, we want to send the key always
}